

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O2

shared_lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::
try_lock_shared_handle_until<int,std::shared_timed_mutex,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (shared_lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this
          ,int *obj,shared_timed_mutex *smutex,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  bool bVar1;
  shared_lock<std::shared_timed_mutex> *this_00;
  shared_lock<std::shared_timed_mutex> local_48;
  shared_lock<std::shared_timed_mutex> local_38;
  shared_lock<std::shared_timed_mutex> local_28;
  
  bVar1 = std::shared_timed_mutex::
          try_lock_shared_until<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((shared_timed_mutex *)obj,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)smutex);
  local_48._M_pm = (mutex_type *)0x0;
  local_48._M_owns = false;
  if (bVar1) {
    __return_storage_ptr__->data = (pointer)this;
    (__return_storage_ptr__->m_handle_lock)._M_pm = (mutex_type *)obj;
    this_00 = &local_28;
  }
  else {
    __return_storage_ptr__->data = (pointer)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_pm = (mutex_type *)obj;
    this_00 = &local_38;
  }
  this_00->_M_pm = (mutex_type *)0x0;
  (__return_storage_ptr__->m_handle_lock)._M_owns = bVar1;
  this_00->_M_owns = false;
  std::shared_lock<std::shared_timed_mutex>::~shared_lock(this_00);
  std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_48);
  return __return_storage_ptr__;
}

Assistant:

shared_lock_handle<T, M>
    try_lock_shared_handle_until(const T* obj, M& smutex, const TimePoint& tp)
{
    typename shared_lock_handle<T, M>::lock_type slock(smutex, tp);
    if (slock.owns_lock()) {
        return shared_lock_handle<T, M>(obj, std::move(slock));
    } else {
        return shared_lock_handle<T, M>(nullptr, std::move(slock));
    }
}